

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O0

void __thiscall cnn::LookupNode::accumulate_grad(LookupNode *this,Tensor *g)

{
  size_type sVar1;
  LookupParameters *in_RSI;
  long in_RDI;
  uint i;
  uint b;
  Tensor *in_stack_00000048;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *gb;
  size_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *in_stack_ffffffffffffffa0;
  uint local_34;
  Tensor *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *this_00;
  
  if (*(long *)(in_RDI + 0x78) == 0) {
    if (*(long *)(in_RDI + 0x98) == 0) {
      __assert_fail("pindices",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/param-nodes.cc"
                    ,0xac,"virtual void cnn::LookupNode::accumulate_grad(const Tensor &)");
    }
    Tensor::batch_elems(in_stack_00000048);
    this_00 = (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)&stack0xffffffffffffffd0;
    local_34 = 0;
    while( true ) {
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x98));
      if (sVar1 <= local_34) break;
      in_stack_ffffffffffffffa0 =
           (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff94 =
           *(uint *)&(in_stack_ffffffffffffffa0->
                     super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
                     super__Vector_impl_data._M_start;
      sVar1 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::size
                        ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
                         (*(long *)(in_RDI + 0xa0) + 0x30));
      if (sVar1 <= in_stack_ffffffffffffff94) {
        __assert_fail("i < params->values.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/param-nodes.cc"
                      ,0xb0,"virtual void cnn::LookupNode::accumulate_grad(const Tensor &)");
      }
      in_stack_ffffffffffffff88 = *(size_type *)(in_RDI + 0xa0);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[](this_00,(ulong)local_34);
      LookupParameters::accumulate_grad
                (in_RSI,(uint)((ulong)this_00 >> 0x20),in_stack_ffffffffffffffe0);
      local_34 = local_34 + 1;
    }
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(in_stack_ffffffffffffffa0);
  }
  else {
    LookupParameters::accumulate_grad
              (in_RSI,(uint)((ulong)in_stack_ffffffffffffffe8 >> 0x20),in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void LookupNode::accumulate_grad(const Tensor& g) {
  if(pindex) {
    params->accumulate_grad(*pindex, g);
  } else {
    assert (pindices);
    const vector<Tensor>& gb = g.batch_elems();
    for (unsigned b = 0; b < pindices->size(); ++b) {
      unsigned i = pindices->at(b);
      assert (i < params->values.size());
      params->accumulate_grad(i, gb[b]);
    }
  }
}